

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endianPPC.cpp
# Opt level: O3

bool isBigEndian(void)

{
  return false;
}

Assistant:

bool isBigEndian(void)
{
#ifdef BYTE_ORDER
    	return BYTE_ORDER == BIG_ENDIAN;
#elif defined _MSC_VER
	return false; // Modern VC++ only runs on x86, x64 and ARM, doesn't require big/little endian conversion
#else
    return __BYTE_ORDER == __BIG_ENDIAN;
#endif
}